

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase604::run(TestCase604 *this)

{
  SourceLocation location;
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  Fault local_508;
  Fault f_10;
  SyscallResult local_4f4;
  SyscallResult _kjSyscallResult_10;
  Fault f_9;
  SyscallResult local_4d4;
  bool local_4cd;
  SyscallResult _kjSyscallResult_9;
  undefined1 local_4c8 [3];
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  DebugComparison<char,_char_&> _kjCondition_1;
  Fault f_8;
  SyscallResult local_488;
  char local_484;
  bool local_483;
  char local_482;
  DebugExpression<char> local_481;
  SyscallResult _kjSyscallResult_8;
  bool _kj_shouldLog;
  DebugComparison<char,_char_&> _kjCondition;
  Fault f_7;
  SyscallResult local_440 [2];
  SyscallResult _kjSyscallResult_7;
  SourceLocation local_418;
  Promise<bool> local_400;
  byte local_3f2;
  undefined1 local_3f0 [6];
  bool oobSupported;
  Promise<void> local_3e8;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:670:62),_void>
  failPromise;
  undefined1 local_3d8 [16];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:669:58),_void>
  promise;
  FdObserver failObserver;
  FdObserver observer;
  Fault f_6;
  SyscallResult local_2f4;
  SyscallResult _kjSyscallResult_6;
  Fault f_5;
  SyscallResult local_2dc;
  undefined1 local_2d8 [4];
  SyscallResult _kjSyscallResult_5;
  int _kj_fd_1;
  OwnFd clientFd;
  undefined1 local_2c8 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:659:3)>
  _kjDefer659;
  Function<void_()> local_2a8;
  undefined1 local_298 [8];
  Thread thread;
  undefined1 local_278 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:629:3)>
  _kjDefer632;
  Fault f_4;
  SyscallResult local_254;
  undefined1 auStack_250 [4];
  SyscallResult _kjSyscallResult_4;
  int failpipe [2];
  Fault f_3;
  SyscallResult local_234;
  SyscallResult _kjSyscallResult_3;
  Fault f_2;
  SyscallResult local_210 [2];
  SyscallResult _kjSyscallResult_2;
  socklen_t saddrLen;
  Fault f_1;
  SyscallResult local_1ec [2];
  SyscallResult _kjSyscallResult_1;
  sockaddr_in saddr;
  Fault local_1d0;
  Fault f;
  SyscallResult local_1c0;
  undefined1 local_1bc [4];
  SyscallResult _kjSyscallResult;
  int _kj_fd;
  OwnFd serverFd;
  char c;
  WaitScope waitScope;
  undefined1 local_180 [8];
  EventLoop loop;
  UnixEventPort port;
  TestCase604 *this_local;
  
  UnixEventPort::UnixEventPort((UnixEventPort *)&loop.currentlyFiring);
  EventLoop::EventLoop((EventLoop *)local_180,(EventPort *)&loop.currentlyFiring);
  WaitScope::WaitScope((WaitScope *)&serverFd,(EventLoop *)local_180);
  f.exception = (Exception *)local_1bc;
  local_1c0 = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase604::run()::__0>
                        ((anon_class_8_1_4955c7dd *)&f,false);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_1c0);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_1c0);
    kj::_::Debug::Fault::Fault
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x268,iVar3,"_kj_fd = socket(2, SOCK_STREAM, 0)","");
    kj::_::Debug::Fault::fatal(&local_1d0);
  }
  OwnFd::OwnFd((OwnFd *)&_kjSyscallResult,(int)local_1bc);
  stack0xfffffffffffffe18 = (DisposalResults *)0x2;
  uVar2 = htonl(0x7f000001);
  _kjSyscallResult_1.errorNumber = uVar2;
  f_1.exception = (Exception *)&_kjSyscallResult;
  local_1ec[0] = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase604::run()::__1>
                           ((anon_class_16_2_59a176ee *)&f_1,false);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(local_1ec);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(local_1ec);
    kj::_::Debug::Fault::Fault
              ((Fault *)&_kjSyscallResult_2,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x26d,iVar3,"bind(serverFd, reinterpret_cast<sockaddr*>(&saddr), sizeof(saddr))","")
    ;
    kj::_::Debug::Fault::fatal((Fault *)&_kjSyscallResult_2);
  }
  local_210[1].errorNumber = 0x10;
  f_2.exception = (Exception *)&_kjSyscallResult;
  local_210[0] = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase604::run()::__2>
                           ((anon_class_24_3_bd1ca383 *)&f_2,false);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(local_210);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(local_210);
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffdd0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x26f,iVar3,"getsockname(serverFd, reinterpret_cast<sockaddr*>(&saddr), &saddrLen)",
               "");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffdd0);
  }
  f_3.exception = (Exception *)&_kjSyscallResult;
  local_234 = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase604::run()::__3>
                        ((anon_class_8_1_3a1f98df *)&f_3,false);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_234);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_234);
    kj::_::Debug::Fault::Fault
              ((Fault *)failpipe,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x270,iVar3,"listen(serverFd, 1)","");
    kj::_::Debug::Fault::fatal((Fault *)failpipe);
  }
  _auStack_250 = (EventLoop *)0x0;
  f_4.exception = (Exception *)auStack_250;
  local_254 = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase604::run()::__4>
                        ((anon_class_8_1_1033bf4a *)&f_4,false);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_254);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_254);
    kj::_::Debug::Fault::Fault
              ((Fault *)&_kjDefer632.maybeFunc.ptr.field_1.value,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x274,iVar3,"pipe(failpipe)","");
    kj::_::Debug::Fault::fatal((Fault *)&_kjDefer632.maybeFunc.ptr.field_1.value);
  }
  thread._16_8_ = auStack_250;
  defer<kj::(anonymous_namespace)::TestCase604::run()::__5>
            ((kj *)local_278,(Type *)&thread.detached);
  _kjDefer659.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:659:3)>_2
        )&_kjSyscallResult;
  Function<void()>::Function<kj::(anonymous_namespace)::TestCase604::run()::__6>
            ((Function<void()> *)&local_2a8,(Type *)&_kjDefer659.maybeFunc.ptr.field_1.value);
  Thread::Thread((Thread *)local_298,&local_2a8);
  Function<void_()>::~Function(&local_2a8);
  __kj_fd_1 = (OwnFd *)&_kjSyscallResult;
  defer<kj::(anonymous_namespace)::TestCase604::run()::__7>((kj *)local_2c8,(Type *)&_kj_fd_1);
  f_5.exception = (Exception *)local_2d8;
  local_2dc = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase604::run()::__8>
                        ((anon_class_8_1_4955c7dd *)&f_5,false);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_2dc);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_2dc);
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffd10,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x295,iVar3,"_kj_fd = socket(2, SOCK_STREAM, 0)","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffd10);
  }
  OwnFd::OwnFd((OwnFd *)&_kjSyscallResult_5,(int)local_2d8);
  f_6.exception = (Exception *)&_kjSyscallResult_5;
  local_2f4 = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase604::run()::__9>
                        ((anon_class_24_3_6ba7e40b *)&f_6,false);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_2f4);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_2f4);
    kj::_::Debug::Fault::Fault
              ((Fault *)&observer.atEnd,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x296,iVar3,"connect(clientFd, reinterpret_cast<sockaddr*>(&saddr), saddrLen)","");
    kj::_::Debug::Fault::fatal((Fault *)&observer.atEnd);
  }
  iVar3 = OwnFd::operator_cast_to_int((OwnFd *)&_kjSyscallResult_5);
  UnixEventPort::FdObserver::FdObserver
            ((FdObserver *)&failObserver.atEnd,(UnixEventPort *)&loop.currentlyFiring,iVar3,5);
  UnixEventPort::FdObserver::FdObserver
            ((FdObserver *)&promise,(UnixEventPort *)&loop.currentlyFiring,(int)auStack_250,5);
  UnixEventPort::FdObserver::whenUrgentDataAvailable((FdObserver *)local_3d8);
  Promise<void>::then<kj::(anonymous_namespace)::TestCase604::run()::__10>
            ((Promise<void> *)(local_3d8 + 8),(Type *)local_3d8);
  Promise<void>::~Promise((Promise<void> *)local_3d8);
  UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_3f0);
  Promise<void>::then<kj::(anonymous_namespace)::TestCase604::run()::__11>
            (&local_3e8,(Type *)local_3f0);
  Promise<void>::~Promise((Promise<void> *)local_3f0);
  mv<kj::Promise<bool>>((Promise<bool> *)&local_3e8);
  SourceLocation::SourceLocation
            (&local_418,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
             ,"run",0x2a0,0x17);
  location.function = local_418.function;
  location.fileName = local_418.fileName;
  location.lineNumber = local_418.lineNumber;
  location.columnNumber = local_418.columnNumber;
  Promise<bool>::exclusiveJoin(&local_400,(Promise<bool> *)(local_3d8 + 8),location);
  SourceLocation::SourceLocation
            ((SourceLocation *)&_kjSyscallResult_7,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
             ,"run",0x2a0,0x17);
  uVar4 = Promise<bool>::wait(&local_400,&serverFd);
  Promise<bool>::~Promise(&local_400);
  local_3f2 = (byte)uVar4 & 1;
  if ((uVar4 & 1) == 0) {
    local_4cd = kj::_::Debug::shouldLog(WARNING);
    while (local_4cd != false) {
      kj::_::Debug::log<char_const(&)[55]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x2b2,WARNING,"\"MSG_OOB doesn\'t seem to be supported on your platform.\"",
                 (char (*) [55])"MSG_OOB doesn\'t seem to be supported on your platform.");
      local_4cd = false;
    }
  }
  else {
    f_7.exception = (Exception *)&_kjSyscallResult_5;
    local_440[0] = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase604::run()::__12>
                             ((anon_class_16_2_f8bdc765 *)&f_7,false);
    pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(local_440);
    if (pvVar5 == (void *)0x0) {
      iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(local_440);
      kj::_::Debug::Fault::Fault
                ((Fault *)&_kjCondition.result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x2ac,iVar3,"recv(clientFd, &c, 1, MSG_OOB)","");
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition.result);
    }
    local_482 = 'o';
    local_481 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_482);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)&_kjSyscallResult_8,&local_481,
               (char *)((long)&_kj_fd + 3));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&_kjSyscallResult_8);
    if (!bVar1) {
      local_483 = kj::_::Debug::shouldLog(ERROR);
      while (local_483 != false) {
        local_484 = 'o';
        kj::_::Debug::log<char_const(&)[30],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x2ad,ERROR,"\"failed: expected \" \"(\'o\') == (c)\", _kjCondition, \'o\', c",
                   (char (*) [30])"failed: expected (\'o\') == (c)",
                   (DebugComparison<char,_char_&> *)&_kjSyscallResult_8,&local_484,
                   (char *)((long)&_kj_fd + 3));
        local_483 = false;
      }
    }
    f_8.exception = (Exception *)&_kjSyscallResult_5;
    local_488 = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase604::run()::__13>
                          ((anon_class_16_2_f8bdc765 *)&f_8,false);
    pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_488);
    if (pvVar5 == (void *)0x0) {
      iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_488);
      kj::_::Debug::Fault::Fault
                ((Fault *)&_kjCondition_1.result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x2ae,iVar3,"recv(clientFd, &c, 1, 0)","");
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1.result);
    }
    _kjSyscallResult_9.errorNumber._2_1_ = 0x69;
    _kjSyscallResult_9.errorNumber._3_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                    (char *)((long)&_kjSyscallResult_9.errorNumber + 2));
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)local_4c8,
               (DebugExpression<char> *)((long)&_kjSyscallResult_9.errorNumber + 3),
               (char *)((long)&_kj_fd + 3));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4c8);
    if (!bVar1) {
      _kjSyscallResult_9.errorNumber._1_1_ = kj::_::Debug::shouldLog(ERROR);
      while ((bool)_kjSyscallResult_9.errorNumber._1_1_ != false) {
        _kjSyscallResult_9.errorNumber._0_1_ = 0x69;
        kj::_::Debug::log<char_const(&)[30],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x2af,ERROR,"\"failed: expected \" \"(\'i\') == (c)\", _kjCondition, \'i\', c",
                   (char (*) [30])"failed: expected (\'i\') == (c)",
                   (DebugComparison<char,_char_&> *)local_4c8,(char *)&_kjSyscallResult_9,
                   (char *)((long)&_kj_fd + 3));
        _kjSyscallResult_9.errorNumber._1_1_ = false;
      }
    }
  }
  _kj_fd._3_1_ = 0x71;
  f_9.exception = (Exception *)&_kjSyscallResult_5;
  local_4d4 = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase604::run()::__14>
                        ((anon_class_16_2_f8bdc765 *)&f_9,false);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_4d4);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_4d4);
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffb10,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x2b7,iVar3,"send(clientFd, &c, 1, 0)","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffb10);
  }
  f_10.exception = (Exception *)&_kjSyscallResult_5;
  local_4f4 = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase604::run()::__15>
                        ((anon_class_8_1_1e115b67 *)&f_10,false);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_4f4);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_4f4);
    kj::_::Debug::Fault::Fault
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x2b8,iVar3,"shutdown(clientFd, SHUT_RDWR)","");
    kj::_::Debug::Fault::fatal(&local_508);
  }
  Promise<bool>::~Promise((Promise<bool> *)&local_3e8);
  Promise<bool>::~Promise((Promise<bool> *)(local_3d8 + 8));
  UnixEventPort::FdObserver::~FdObserver((FdObserver *)&promise);
  UnixEventPort::FdObserver::~FdObserver((FdObserver *)&failObserver.atEnd);
  OwnFd::~OwnFd((OwnFd *)&_kjSyscallResult_5);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:659:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:659:3)>
               *)local_2c8);
  Thread::~Thread((Thread *)local_298);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:629:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:629:3)>
               *)local_278);
  OwnFd::~OwnFd((OwnFd *)&_kjSyscallResult);
  WaitScope::~WaitScope((WaitScope *)&serverFd);
  EventLoop::~EventLoop((EventLoop *)local_180);
  UnixEventPort::~UnixEventPort((UnixEventPort *)&loop.currentlyFiring);
  return;
}

Assistant:

TEST(AsyncUnixTest, UrgentObserver) {
  // Verify that FdObserver correctly detects availability of out-of-band data.
  // Availability of out-of-band data is implementation-specific.
  // Linux's and OS X's TCP/IP stack supports out-of-band messages for TCP sockets, which is used
  // for this test.

  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);
  char c;

  // Spawn a TCP server
  auto serverFd = KJ_SYSCALL_FD(socket(AF_INET, SOCK_STREAM, 0));
  sockaddr_in saddr;
  memset(&saddr, 0, sizeof(saddr));
  saddr.sin_family = AF_INET;
  saddr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
  KJ_SYSCALL(bind(serverFd, reinterpret_cast<sockaddr*>(&saddr), sizeof(saddr)));
  socklen_t saddrLen = sizeof(saddr);
  KJ_SYSCALL(getsockname(serverFd, reinterpret_cast<sockaddr*>(&saddr), &saddrLen));
  KJ_SYSCALL(listen(serverFd, 1));

  // Create a pipe that we'll use to signal if MSG_OOB return EINVAL.
  int failpipe[2]{};
  KJ_SYSCALL(pipe(failpipe));
  KJ_DEFER({
    close(failpipe[0]);
    close(failpipe[1]);
  });

  // Accept one connection, send in-band and OOB byte, wait for a quit message
  Thread thread([&]() {
    char c;

    sockaddr_in caddr;
    socklen_t caddrLen = sizeof(caddr);
    auto clientFd = KJ_SYSCALL_FD(accept(serverFd, reinterpret_cast<sockaddr*>(&caddr), &caddrLen));
    delay();

    // Workaround: OS X won't signal POLLPRI without POLLIN. Also enqueue some in-band data.
    c = 'i';
    KJ_SYSCALL(send(clientFd, &c, 1, 0));
    c = 'o';
    KJ_SYSCALL_HANDLE_ERRORS(send(clientFd, &c, 1, MSG_OOB)) {
      case EINVAL:
        // Looks like MSG_OOB is not supported. (This is the case e.g. on WSL.)
        KJ_SYSCALL(write(failpipe[1], &c, 1));
        break;
      default:
        KJ_FAIL_SYSCALL("send(..., MSG_OOB)", error);
    }

    KJ_SYSCALL(recv(clientFd, &c, 1, 0));
    EXPECT_EQ('q', c);
  });
  KJ_DEFER({ shutdown(serverFd, SHUT_RDWR); serverFd = nullptr; });

  auto clientFd = KJ_SYSCALL_FD(socket(AF_INET, SOCK_STREAM, 0));
  KJ_SYSCALL(connect(clientFd, reinterpret_cast<sockaddr*>(&saddr), saddrLen));

  UnixEventPort::FdObserver observer(port, clientFd,
      UnixEventPort::FdObserver::OBSERVE_READ | UnixEventPort::FdObserver::OBSERVE_URGENT);
  UnixEventPort::FdObserver failObserver(port, failpipe[0],
      UnixEventPort::FdObserver::OBSERVE_READ | UnixEventPort::FdObserver::OBSERVE_URGENT);

  auto promise = observer.whenUrgentDataAvailable().then([]() { return true; });
  auto failPromise = failObserver.whenBecomesReadable().then([]() { return false; });

  bool oobSupported = promise.exclusiveJoin(kj::mv(failPromise)).wait(waitScope);
  if (oobSupported) {
#if __CYGWIN__
    // On Cygwin, reading the urgent byte first causes the subsequent regular read to block until
    // such a time as the connection closes -- and then the byte is successfully returned. This
    // seems to be a cygwin bug.
    KJ_SYSCALL(recv(clientFd, &c, 1, 0));
    EXPECT_EQ('i', c);
    KJ_SYSCALL(recv(clientFd, &c, 1, MSG_OOB));
    EXPECT_EQ('o', c);
#else
    // Attempt to read the urgent byte prior to reading the in-band byte.
    KJ_SYSCALL(recv(clientFd, &c, 1, MSG_OOB));
    EXPECT_EQ('o', c);
    KJ_SYSCALL(recv(clientFd, &c, 1, 0));
    EXPECT_EQ('i', c);
#endif
  } else {
    KJ_LOG(WARNING, "MSG_OOB doesn't seem to be supported on your platform.");
  }

  // Allow server thread to let its clientFd go out of scope.
  c = 'q';
  KJ_SYSCALL(send(clientFd, &c, 1, 0));
  KJ_SYSCALL(shutdown(clientFd, SHUT_RDWR));
}